

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O0

void soul::throwInternalCompilerError(char *message,char *location,int line)

{
  string local_118;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  char *pcStack_18;
  int line_local;
  char *location_local;
  char *message_local;
  
  local_1c = line;
  pcStack_18 = location;
  location_local = message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,message,&local_e1);
  choc::text::addDoubleQuotes(&local_c0,&local_e0);
  std::operator+(&local_a0,&local_c0," failed at ");
  std::operator+(&local_80,&local_a0,pcStack_18);
  std::operator+(&local_60,&local_80,":");
  std::__cxx11::to_string(&local_118,local_1c);
  std::operator+(&local_40,&local_60,&local_118);
  throwInternalCompilerError(&local_40);
}

Assistant:

[[noreturn]] void throwInternalCompilerError (const char* message, const char* location, int line)
{
    throwInternalCompilerError (choc::text::addDoubleQuotes (message) + " failed at " + location + ":" + std::to_string (line));
}